

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

bool __thiscall merlin::variable_set::operator==(variable_set *this,variable_set *B)

{
  size_t sVar1;
  size_t sVar2;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  undefined1 local_31;
  variable_set *B_local;
  variable_set *this_local;
  
  sVar1 = size(this);
  sVar2 = size(B);
  local_31 = false;
  if (sVar1 == sVar2) {
    __first1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_v);
    __last1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_v);
    __first2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&B->m_v);
    local_31 = std::
               equal<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )__first1._M_current,
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )__last1._M_current,
                          (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )__first2._M_current);
  }
  return local_31;
}

Assistant:

bool operator==(const variable_set& B) const {
		return (size() == B.size())
				&& std::equal(m_v.begin(), m_v.end(), B.m_v.begin());
	}